

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O3

var __thiscall cs::runtime_type::parse_lnkasi(runtime_type *this,iterator a,var *b)

{
  token_base *ptVar1;
  proxy *ppVar2;
  int iVar3;
  token_base **pptVar4;
  var *pvVar5;
  runtime_error *prVar6;
  any *in_RCX;
  runtime_type *this_00;
  undefined1 local_60 [8];
  undefined1 local_58 [32];
  iterator local_38;
  CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  local_30;
  tree_node *local_28;
  
  local_38.mData = (tree_node *)b;
  pptVar4 = tree_type<cs::token_base_*>::iterator::data(&local_38);
  ptVar1 = *pptVar4;
  iVar3 = (*ptVar1->_vptr_token_base[2])(ptVar1);
  if (iVar3 == 4) {
    pvVar5 = domain_manager::get_var((domain_manager *)&a.mData[1].right,(var_id *)(ptVar1 + 1));
    cs_impl::any::operator=(pvVar5,in_RCX);
    ppVar2 = pvVar5->mDat;
    if (ppVar2 != (proxy *)0x0) {
      ppVar2->refcount = ppVar2->refcount + 1;
    }
    (this->literals).
    super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
    .
    super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
    .ctrl_ = &ppVar2->is_rvalue;
  }
  else {
    iVar3 = (*ptVar1->_vptr_token_base[2])(ptVar1);
    if (iVar3 != 3) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x28);
      local_58._0_8_ = local_58 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,"Unexpected left operand in link assign expression.","");
      runtime_error::runtime_error(prVar6,(string *)local_58);
      __cxa_throw(prVar6,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    if (*(int *)&ptVar1[1]._vptr_token_base == 0x28) {
      local_30.
      super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
      .
      super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
      .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                )tree_type<cs::token_base_*>::iterator::left(&local_38);
      parse_expr((runtime_type *)local_58,(iterator *)a.mData,SUB81(&local_30,0));
      local_28 = (tree_node *)tree_type<cs::token_base_*>::iterator::right(&local_38);
      this_00 = (runtime_type *)local_60;
      parse_expr(this_00,(iterator *)a.mData,SUB81(&local_28,0));
      pvVar5 = parse_access_lhs(this_00,(var *)local_58,(var *)local_60);
      cs_impl::any::operator=(pvVar5,in_RCX);
      ppVar2 = pvVar5->mDat;
      if (ppVar2 != (proxy *)0x0) {
        ppVar2->refcount = ppVar2->refcount + 1;
      }
      (this->literals).
      super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
      .
      super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
      .ctrl_ = &ppVar2->is_rvalue;
      cs_impl::any::recycle((any *)local_60);
    }
    else {
      if (*(int *)&ptVar1[1]._vptr_token_base != 0xe) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x28);
        local_58._0_8_ = local_58 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_58,"Unexpected left operand in link assign expression.","");
        runtime_error::runtime_error(prVar6,(string *)local_58);
        __cxa_throw(prVar6,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      local_30.
      super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
      .
      super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
      .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                )tree_type<cs::token_base_*>::iterator::left(&local_38);
      parse_expr((runtime_type *)local_58,(iterator *)a.mData,SUB81(&local_30,0));
      local_60 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::right(&local_38);
      pptVar4 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_60);
      pvVar5 = parse_dot_lhs((runtime_type *)a.mData,(var *)local_58,*pptVar4);
      cs_impl::any::operator=(pvVar5,in_RCX);
      ppVar2 = pvVar5->mDat;
      if (ppVar2 != (proxy *)0x0) {
        ppVar2->refcount = ppVar2->refcount + 1;
      }
      (this->literals).
      super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
      .
      super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
      .ctrl_ = &ppVar2->is_rvalue;
    }
    cs_impl::any::recycle((any *)local_58);
  }
  return (var)(proxy *)this;
}

Assistant:

var runtime_type::parse_lnkasi(tree_type<token_base *>::iterator a, const var &b)
	{
		token_base *token = a.data();
		if (token->get_type() == token_types::id)
			return parse_lnkasi(storage.get_var(static_cast<token_id *>(token)->get_id()), b);
		else if (token->get_type() == token_types::signal) {
			switch (static_cast<token_signal *>(token)->get_signal()) {
			case signal_types::dot_:
				return parse_lnkasi(parse_dot_lhs(parse_expr(a.left()), a.right().data()), b);
			case signal_types::access_:
				return parse_lnkasi(parse_access_lhs(parse_expr(a.left()), parse_expr(a.right())), b);
			default:
				throw runtime_error("Unexpected left operand in link assign expression.");
			}
		}
		else
			throw runtime_error("Unexpected left operand in link assign expression.");
	}